

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void obj_to_keeper(OBJ_DATA *obj,CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  OBJ_DATA **ppOVar5;
  
  ppOVar5 = &ch->carrying;
  pOVar4 = ch->carrying;
  if (ch->carrying == (OBJ_DATA *)0x0) {
    pOVar4 = (OBJ_DATA *)0x0;
  }
  else {
    do {
      pOVar1 = pOVar4->next_content;
      if (obj->pIndexData == pOVar4->pIndexData) {
        bVar2 = str_cmp(obj->short_descr,pOVar4->short_descr);
        if (!bVar2) {
          bVar2 = is_obj_stat(pOVar4,0xd);
          if (bVar2) {
            extract_obj(obj);
            return;
          }
          ppOVar5 = &pOVar4->next_content;
          obj->cost = pOVar4->cost;
          break;
        }
      }
      pOVar4 = pOVar1;
    } while (pOVar1 != (OBJ_DATA *)0x0);
    pOVar4 = *ppOVar5;
  }
  obj->next_content = pOVar4;
  *ppOVar5 = obj;
  obj->carried_by = ch;
  obj->in_room = (ROOM_INDEX_DATA *)0x0;
  obj->in_obj = (OBJ_DATA *)0x0;
  iVar3 = get_obj_number(obj);
  ch->carry_number = ch->carry_number + (short)iVar3;
  iVar3 = get_obj_weight(obj);
  ch->carry_weight = ch->carry_weight + (short)iVar3;
  return;
}

Assistant:

void obj_to_keeper(OBJ_DATA *obj, CHAR_DATA *ch)
{
	OBJ_DATA *t_obj, *t_obj_next;

	/* see if any duplicates are found */
	for (t_obj = ch->carrying; t_obj != nullptr; t_obj = t_obj_next)
	{
		t_obj_next = t_obj->next_content;

		if (obj->pIndexData == t_obj->pIndexData && !str_cmp(obj->short_descr, t_obj->short_descr))
		{
			/* if this is an unlimited item, destroy the new one */
			if (is_obj_stat(t_obj, ITEM_INVENTORY))
			{
				extract_obj(obj);
				return;
			}

			obj->cost = t_obj->cost; /* keep it standard */
			break;
		}
	}

	if (t_obj == nullptr)
	{
		obj->next_content = ch->carrying;
		ch->carrying = obj;
	}
	else
	{
		obj->next_content = t_obj->next_content;
		t_obj->next_content = obj;
	}

	obj->carried_by = ch;
	obj->in_room = nullptr;
	obj->in_obj = nullptr;
	ch->carry_number += get_obj_number(obj);
	ch->carry_weight += get_obj_weight(obj);
}